

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O0

void __thiscall
TEST_MemoryLeakDetectorTest_TwoAllocOneFreeOneLeak_Test::testBody
          (TEST_MemoryLeakDetectorTest_TwoAllocOneFreeOneLeak_Test *this)

{
  int iVar1;
  bool bVar2;
  char *pcVar3;
  UtestShell *pUVar4;
  size_t sVar5;
  TestTerminator *pTVar6;
  SimpleString local_60;
  SimpleString local_50 [2];
  undefined1 local_30 [8];
  SimpleString output;
  char *mem2;
  char *mem;
  TEST_MemoryLeakDetectorTest_TwoAllocOneFreeOneLeak_Test *this_local;
  
  pcVar3 = MemoryLeakDetector::allocMemory
                     ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
                      &((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).testAllocator)
                       ->super_TestMemoryAllocator,4,false);
  output.bufferSize_ =
       (size_t)MemoryLeakDetector::allocMemory
                         ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
                          &((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).
                           testAllocator)->super_TestMemoryAllocator,0xc,false);
  MemoryLeakDetector::deallocMemory
            ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
             &((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).testAllocator)->
              super_TestMemoryAllocator,pcVar3,false);
  MemoryLeakDetector::stopChecking
            ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector);
  pcVar3 = MemoryLeakDetector::report
                     ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
                      mem_leak_period_checking);
  SimpleString::SimpleString((SimpleString *)local_30,pcVar3);
  pUVar4 = UtestShell::getCurrent();
  sVar5 = MemoryLeakDetector::totalMemoryLeaks
                    ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
                     mem_leak_period_checking);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0xe])
            (pUVar4,1,sVar5,
             "LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_checking)) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0xf5,pTVar6);
  pUVar4 = UtestShell::getCurrent();
  SimpleString::SimpleString(local_50,"Leak size: 12");
  bVar2 = SimpleString::contains((SimpleString *)local_30,local_50);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)bVar2,"CHECK","output.contains(\"Leak size: 12\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0xf6,pTVar6);
  SimpleString::~SimpleString(local_50);
  pUVar4 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_60,"Leak size: 4");
  bVar2 = SimpleString::contains((SimpleString *)local_30,&local_60);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)!bVar2,"CHECK","!output.contains(\"Leak size: 4\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0xf7,pTVar6);
  SimpleString::~SimpleString(&local_60);
  (*PlatformSpecificFree)((void *)output.bufferSize_);
  pUVar4 = UtestShell::getCurrent();
  iVar1 = *(int *)&(((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).testAllocator)->
                   super_TestMemoryAllocator).field_0x24;
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0xe])
            (pUVar4,2,(long)iVar1,"LONGS_EQUAL(2, testAllocator->alloc_called) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0xf9,pTVar6);
  pUVar4 = UtestShell::getCurrent();
  iVar1 = ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).testAllocator)->free_called;
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0xe])
            (pUVar4,1,(long)iVar1,"LONGS_EQUAL(1, testAllocator->free_called) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0xfa,pTVar6);
  SimpleString::~SimpleString((SimpleString *)local_30);
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, TwoAllocOneFreeOneLeak)
{
    char* mem = detector->allocMemory(testAllocator, 4);
    char* mem2 = detector->allocMemory(testAllocator, 12);
    detector->deallocMemory(testAllocator, mem);
    detector->stopChecking();
    SimpleString output = detector->report(mem_leak_period_checking);
    LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_checking));
    CHECK(output.contains("Leak size: 12"));
    CHECK(!output.contains("Leak size: 4"));
    PlatformSpecificFree(mem2);
    LONGS_EQUAL(2, testAllocator->alloc_called);
    LONGS_EQUAL(1, testAllocator->free_called);
}